

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strrpos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  int iVar2;
  char *pcVar3;
  char *pPattern;
  jx9_value *pjVar4;
  long lVar5;
  sxu32 nLen_00;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  int nLen;
  sxu32 nOfft;
  int nPatLen;
  int local_44;
  sxu32 local_40;
  sxu32 local_3c;
  jx9_context *local_38;
  
  if (nArg < 2) goto LAB_00130f59;
  pcVar3 = jx9_value_to_string(*apArg,&local_44);
  pPattern = jx9_value_to_string(apArg[1],(int *)&local_3c);
  iVar2 = local_44;
  local_40 = 0;
  pcVar7 = pcVar3;
  if (nArg == 2) {
LAB_0013100a:
    if ((0 < local_44) && (0 < (int)local_3c)) {
      pcVar3 = pcVar3 + iVar2;
      lVar5 = -(long)iVar2;
      nLen_00 = 1;
      local_38 = pCtx;
      do {
        pcVar3 = pcVar3 + -1;
        if (pcVar3 <= pcVar7) {
          pjVar4 = local_38->pRet;
          goto LAB_00130f5d;
        }
        sVar1 = SyBlobSearch(pcVar3,nLen_00,pPattern,local_3c,&local_40);
        lVar5 = lVar5 + 1;
        nLen_00 = nLen_00 + 1;
      } while (sVar1 != 0);
      uVar8 = (ulong)local_40;
      pjVar4 = local_38->pRet;
      jx9MemObjRelease(pjVar4);
      (pjVar4->x).pOther = (void *)(uVar8 - lVar5);
      uVar6 = 2;
      goto LAB_00130f71;
    }
  }
  else {
    pjVar4 = apArg[2];
    jx9MemObjToInteger(pjVar4);
    uVar6 = (uint)(pjVar4->x).iVal;
    if ((int)uVar6 < 0) {
      if (local_44 != -uVar6 && SBORROW4(local_44,-uVar6) == (int)(local_44 + uVar6) < 0) {
        iVar2 = local_44 + uVar6;
        local_44 = iVar2;
        goto LAB_0013100a;
      }
    }
    else if (local_44 - uVar6 != 0 && (int)uVar6 <= local_44) {
      pcVar7 = pcVar3 + (uVar6 & 0x7fffffff);
      local_44 = local_44 - uVar6;
      goto LAB_0013100a;
    }
  }
LAB_00130f59:
  pjVar4 = pCtx->pRet;
LAB_00130f5d:
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  uVar6 = 8;
LAB_00130f71:
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | uVar6;
  return 0;
}

Assistant:

static int jx9Builtin_strrpos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zStart, *zBlob, *zPattern, *zPtr, *zEnd;
	ProcStringMatch xPatternMatch = SyBlobSearch; /* Case-sensitive pattern match */
	int nLen, nPatLen;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	/* Point to the end of the pattern */
	zPtr = &zBlob[nLen - 1];
	zEnd = &zBlob[nLen];
	/* Save the starting posistion */
	zStart = zBlob;
	nOfft = 0; /* cc warning */
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		int nStart;
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				nLen -= nStart;
				zPtr = &zBlob[nLen - 1];
				zEnd = &zBlob[nLen];
			}
		}else{
			if( nStart >= nLen ){
				/* Invalid offset */
				jx9_result_bool(pCtx, 0);
				return JX9_OK;
			}else{
				zBlob += nStart;
				nLen -= nStart;
			}
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		for(;;){
			if( zBlob >= zPtr ){
				break;
			}
			rc = xPatternMatch((const void *)zPtr, (sxu32)(zEnd-zPtr), (const void *)zPattern, (sxu32)nPatLen, &nOfft);
			if( rc == SXRET_OK ){
				/* Pattern found, return it's position */
				jx9_result_int64(pCtx, (jx9_int64)(&zPtr[nOfft] - zStart));
				return JX9_OK;
			}
			zPtr--;
		}
		/* Pattern not found, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}